

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_doc.c
# Opt level: O0

HPDF_ExtGState HPDF_CreateExtGState(HPDF_Doc pdf)

{
  HPDF_BOOL HVar1;
  HPDF_PDFVer local_24;
  HPDF_ExtGState ext_gstate;
  HPDF_Doc pdf_local;
  
  HVar1 = HPDF_HasDoc(pdf);
  if (HVar1 == 0) {
    pdf_local = (HPDF_Doc)0x0;
  }
  else {
    if (pdf->pdf_version < HPDF_VER_15) {
      local_24 = HPDF_VER_14;
    }
    else {
      local_24 = pdf->pdf_version;
    }
    pdf->pdf_version = local_24;
    pdf_local = (HPDF_Doc)HPDF_ExtGState_New(pdf->mmgr,pdf->xref);
    if (pdf_local == (HPDF_Doc)0x0) {
      HPDF_CheckError(&pdf->error);
    }
  }
  return (HPDF_ExtGState)pdf_local;
}

Assistant:

HPDF_EXPORT(HPDF_ExtGState)
HPDF_CreateExtGState  (HPDF_Doc  pdf)
{
    HPDF_ExtGState ext_gstate;

    if (!HPDF_HasDoc (pdf))
        return NULL;

    pdf->pdf_version = (pdf->pdf_version > HPDF_VER_14 ? pdf->pdf_version : HPDF_VER_14);

    ext_gstate = HPDF_ExtGState_New (pdf->mmgr, pdf->xref);
    if (!ext_gstate)
        HPDF_CheckError (&pdf->error);

    return ext_gstate;
}